

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O3

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkDirFrame::GetConstraintViolation(ChLinkDirFrame *this)

{
  undefined8 uVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  void *pvVar9;
  undefined8 *puVar10;
  ulong uVar11;
  long in_RSI;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ChVectorDynamic<> CVar23;
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_80;
  ChMatrix33<double> local_60;
  
  lVar5 = *(long *)(in_RSI + 0x1d0);
  auVar22._24_8_ = *(undefined8 *)(in_RSI + 0x200);
  auVar22._16_8_ = *(undefined8 *)(in_RSI + 0x200);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(lVar5 + 0x28);
  auVar4 = *(undefined1 (*) [16])(lVar5 + 0x30);
  auVar6 = vpermpd_avx2(*(undefined1 (*) [32])(in_RSI + 0x1f8),1);
  auVar7 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(in_RSI + 0x208)),0x15);
  auVar20._0_8_ = *(ulong *)(lVar5 + 0x28) ^ 0x8000000000000000;
  auVar20._8_8_ = 0x8000000000000000;
  auVar17._0_8_ = -auVar4._0_8_;
  auVar17._8_8_ = -auVar4._8_8_;
  auVar13 = vunpcklpd_avx(auVar20,auVar13);
  auVar16._16_16_ = auVar4;
  auVar16._0_16_ = auVar13;
  auVar12._0_8_ = auVar6._0_8_ * auVar13._0_8_;
  auVar12._8_8_ = auVar6._8_8_ * auVar13._8_8_;
  auVar12._16_8_ = auVar6._16_8_ * auVar4._0_8_;
  auVar12._24_8_ = auVar6._24_8_ * auVar4._8_8_;
  uVar1 = *(undefined8 *)(lVar5 + 0x20);
  auVar6._8_8_ = uVar1;
  auVar6._0_8_ = uVar1;
  auVar6._16_8_ = uVar1;
  auVar6._24_8_ = uVar1;
  auVar12 = vfmadd231pd_avx512vl(auVar12,*(undefined1 (*) [32])(in_RSI + 0x1f8),auVar6);
  auVar21._24_8_ = *(undefined8 *)(lVar5 + 0x38);
  auVar21._16_8_ = *(undefined8 *)(lVar5 + 0x38);
  auVar22._8_8_ = *(undefined8 *)(in_RSI + 0x208);
  auVar22._0_8_ = *(undefined8 *)(in_RSI + 0x208);
  auVar6 = vpermpd_avx2(auVar16,0x66);
  auVar21._0_16_ = auVar17;
  auVar19._16_16_ = auVar20;
  auVar19._0_16_ = auVar17;
  auVar6 = vshufpd_avx(auVar19,auVar6,9);
  auVar16 = vpermpd_avx2(auVar21,0x24);
  auVar4 = vfmadd213pd_fma(auVar22,auVar16,auVar12);
  auVar4 = vfmadd213pd_fma(auVar6,auVar7,ZEXT1632(auVar4));
  local_80.m_data = (double  [4])ZEXT1632(auVar4);
  ChMatrix33<double>::ChMatrix33(&local_60,&local_80);
  lVar5 = *(long *)(in_RSI + 0x1c0);
  uVar1 = *(undefined8 *)(lVar5 + 0xf0);
  dVar2 = *(double *)(lVar5 + 0xf8);
  uVar3 = *(undefined8 *)(lVar5 + 0x100);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)SUB168(ZEXT816(0) << 0x20,0);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus =
       (_Alloc_hider)SUB168(ZEXT816(0) << 0x20,8);
  pvVar9 = malloc(0x50);
  if (pvVar9 == (void *)0x0) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  auVar18._8_8_ = uVar1;
  auVar18._0_8_ = uVar1;
  uVar11 = (ulong)pvVar9 & 0xffffffffffffffc0;
  auVar14._0_8_ =
       dVar2 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar14._8_8_ =
       dVar2 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  *(void **)(uVar11 + 0x38) = pvVar9;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)(uVar11 + 0x40);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x2;
  auVar4._8_8_ = local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar4._0_8_ = local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar4 = vfmadd132pd_fma(auVar18,auVar14,auVar4);
  auVar15._8_8_ = uVar3;
  auVar15._0_8_ = uVar3;
  auVar8._8_8_ = local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar8._0_8_ = local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar4 = vfmadd132pd_fma(auVar15,auVar4,auVar8);
  *(undefined1 (*) [16])(uVar11 + 0x40) = auVar4;
  CVar23.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)(uVar11 + 0x40);
  CVar23.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ChVectorDynamic<>)
         CVar23.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ChVectorDynamic<> ChLinkDirFrame::GetConstraintViolation() const {
    ChMatrix33<> Arw = m_csys.rot >> m_body->coord.rot;
    ChVector<> res = Arw.transpose() * m_node->GetD();
    ChVectorN<double, 2> C;
    C(0) = res.y();
    C(1) = res.z();
    return C;
}